

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O3

bool __thiscall
QFSFileEnginePrivate::nativeOpen
          (QFSFileEnginePrivate *this,OpenMode openMode,
          optional<QFlags<QFileDevice::Permission>_> permissions)

{
  bool bVar1;
  uint uVar2;
  mode_t mode;
  uint uVar3;
  
  mode = 0x1b6;
  if (((ulong)permissions.super__Optional_base<QFlags<QFileDevice::Permission>,_true,_true>.
              _M_payload.super__Optional_payload_base<QFlags<QFileDevice::Permission>_> >> 0x20 & 1)
      != 0) {
    uVar2 = (uint)(((ulong)permissions.
                           super__Optional_base<QFlags<QFileDevice::Permission>,_true,_true>.
                           _M_payload.super__Optional_payload_base<QFlags<QFileDevice::Permission>_>
                   & 0x4400) != 0) * 0x100;
    uVar3 = uVar2 + 0x80;
    if (((ulong)permissions.super__Optional_base<QFlags<QFileDevice::Permission>,_true,_true>.
                _M_payload.super__Optional_payload_base<QFlags<QFileDevice::Permission>_> & 0x2200)
        == 0) {
      uVar3 = uVar2;
    }
    uVar2 = uVar3 + 0x40;
    if (((ulong)permissions.super__Optional_base<QFlags<QFileDevice::Permission>,_true,_true>.
                _M_payload.super__Optional_payload_base<QFlags<QFileDevice::Permission>_> & 0x1100)
        == 0) {
      uVar2 = uVar3;
    }
    mode = (uint)((ulong)permissions.
                         super__Optional_base<QFlags<QFileDevice::Permission>,_true,_true>.
                         _M_payload.super__Optional_payload_base<QFlags<QFileDevice::Permission>_>
                 >> 1) & 0x38 |
           (uint)permissions.super__Optional_base<QFlags<QFileDevice::Permission>,_true,_true>.
                 _M_payload.super__Optional_payload_base<QFlags<QFileDevice::Permission>_>.
                 _M_payload & 7 | uVar2;
  }
  bVar1 = nativeOpenImpl(this,openMode,mode);
  return bVar1;
}

Assistant:

bool QFSFileEnginePrivate::nativeOpen(QIODevice::OpenMode openMode,
                                      std::optional<QFile::Permissions> permissions)
{
    return nativeOpenImpl(openMode, permissions ? QtPrivate::toMode_t(*permissions) : 0666);
}